

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walWriteOneFrame(WalWriter *p,PgHdr *pPage,int nTruncate,sqlite3_int64 iOffset)

{
  long in_RSI;
  u8 aFrame [24];
  void *pData;
  int rc;
  sqlite3_int64 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  u8 *in_stack_ffffffffffffffc0;
  WalWriter *p_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  p_00 = *(WalWriter **)(in_RSI + 8);
  walEncodeFrame((Wal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (u32)((ulong)p_00 >> 0x20),(u32)p_00,in_stack_ffffffffffffffc0,
                 (u8 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  local_4 = walWriteToLog(p_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb0);
  if (local_4 == 0) {
    local_4 = walWriteToLog(p_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb0);
  }
  return local_4;
}

Assistant:

static int walWriteOneFrame(
  WalWriter *p,               /* Where to write the frame */
  PgHdr *pPage,               /* The page of the frame to be written */
  int nTruncate,              /* The commit flag.  Usually 0.  >0 for commit */
  sqlite3_int64 iOffset       /* Byte offset at which to write */
){
  int rc;                         /* Result code from subfunctions */
  void *pData;                    /* Data actually written */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-header in */
#if defined(SQLITE_HAS_CODEC)
  if( (pData = sqlite3PagerCodec(pPage))==0 ) return SQLITE_NOMEM_BKPT;
#else
  pData = pPage->pData;
#endif
  walEncodeFrame(p->pWal, pPage->pgno, nTruncate, pData, aFrame);
  rc = walWriteToLog(p, aFrame, sizeof(aFrame), iOffset);
  if( rc ) return rc;
  /* Write the page data */
  rc = walWriteToLog(p, pData, p->szPage, iOffset+sizeof(aFrame));
  return rc;
}